

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btorsimstate.cpp
# Opt level: O0

int __thiscall BtorSimState::remove(BtorSimState *this,char *__filename)

{
  BtorSimBitVector *pBVar1;
  BtorSimState *extraout_RAX;
  BtorSimArrayModel *in_stack_00000020;
  
  if (this->type == BITVEC) {
    if ((this->field_1).bv_state != (BtorSimBitVector *)0x0) {
      btorsim_bv_free((BtorSimBitVector *)0x1235fa);
    }
    (this->field_1).bv_state = (BtorSimBitVector *)0x0;
  }
  else if (this->type == ARRAY) {
    if (((this->field_1).bv_state != (BtorSimBitVector *)0x0) &&
       (pBVar1 = (this->field_1).bv_state, pBVar1 != (BtorSimBitVector *)0x0)) {
      BtorSimArrayModel::~BtorSimArrayModel(in_stack_00000020);
      operator_delete(pBVar1);
    }
    (this->field_1).bv_state = (BtorSimBitVector *)0x0;
  }
  else {
    die("Removing invalid state!");
    this = extraout_RAX;
  }
  return (int)this;
}

Assistant:

void
BtorSimState::remove ()
{
  switch (type)
  {
    case ARRAY:
      if (array_state) delete array_state;
      array_state = nullptr;
      break;
    case BtorSimState::Type::BITVEC:
      if (bv_state) btorsim_bv_free (bv_state);
      bv_state = nullptr;
      break;
    default: die ("Removing invalid state!");
  }
}